

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

void __thiscall absl::CondVar::Wakeup(CondVar *this,PerThreadSynch *w)

{
  long lVar1;
  Mutex *pMVar2;
  uint uVar3;
  PerThreadSynch *pPVar4;
  int mode;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 in_RDX;
  SynchWaitParams *waitp;
  synchronization_internal *this_00;
  ulong mu;
  bool bVar5;
  SynchWaitParams *pSVar6;
  
  pSVar6 = w->waitp;
  if (((pSVar6->timeout).ns_ != 0) || (pMVar2 = pSVar6->cvmu, pMVar2 == (Mutex *)0x0)) {
    w->next = (PerThreadSynch *)0x0;
    (w->state)._M_i = kAvailable;
    AbslInternalPerThreadSemPost((ThreadIdentity *)w);
    return;
  }
  waitp = w->waitp;
  if (waitp->cond != (Condition *)0x0) {
    raw_logging_internal::RawLog
              (kFatal,"mutex.cc",0x947,"Check %s failed: %s","w->waitp->cond == nullptr",
               "Mutex::Fer while waiting on Condition",pSVar6);
    waitp = w->waitp;
    in_RDX = extraout_RDX_00;
  }
  if ((waitp->timeout).ns_ != 0) {
    raw_logging_internal::RawLog
              (kFatal,"mutex.cc",0x949,"Check %s failed: %s","!w->waitp->timeout.has_timeout()",
               "Mutex::Fer while in timed wait",pSVar6);
    waitp = w->waitp;
    in_RDX = extraout_RDX_01;
  }
  if (waitp->cv_word != (atomic<long> *)0x0) {
    raw_logging_internal::RawLog
              (kFatal,"mutex.cc",0x94b,"Check %s failed: %s","w->waitp->cv_word == nullptr",
               "Mutex::Fer with pending CondVar queueing",pSVar6);
    waitp = w->waitp;
    in_RDX = extraout_RDX_02;
  }
  mu = (pMVar2->mu_).super___atomic_base<long>._M_i;
  if (((waitp->how != (MuHow)kSharedS | 8) & (uint)mu) != 0) {
    this_00 = (synchronization_internal *)0x0;
    do {
      mode = (int)in_RDX;
      if ((mu & 0x44) == 0) {
        pPVar4 = Enqueue((PerThreadSynch *)0x0,waitp,mu,2);
        mode = extraout_EDX;
        if (pPVar4 == (PerThreadSynch *)0x0) {
          Mutex::Fer();
          mode = extraout_EDX_00;
        }
        LOCK();
        bVar5 = mu == (pMVar2->mu_).super___atomic_base<long>._M_i;
        if (bVar5) {
          (pMVar2->mu_).super___atomic_base<long>._M_i =
               (ulong)((uint)mu & 0xbb) | (ulong)pPVar4 | 4;
        }
        UNLOCK();
        if (bVar5) {
          return;
        }
      }
      else if ((mu & 0x40) == 0) {
        LOCK();
        bVar5 = mu == (pMVar2->mu_).super___atomic_base<long>._M_i;
        if (bVar5) {
          (pMVar2->mu_).super___atomic_base<long>._M_i = mu | 0x44;
        }
        UNLOCK();
        if (bVar5) {
          pPVar4 = Enqueue((PerThreadSynch *)(mu & 0xffffffffffffff00),w->waitp,mu,2);
          if (pPVar4 == (PerThreadSynch *)0x0) {
            Mutex::Fer();
          }
          do {
            lVar1 = (pMVar2->mu_).super___atomic_base<long>._M_i;
            LOCK();
            bVar5 = lVar1 == (pMVar2->mu_).super___atomic_base<long>._M_i;
            if (bVar5) {
              (pMVar2->mu_).super___atomic_base<long>._M_i =
                   (ulong)((uint)lVar1 & 0xbb) | (ulong)pPVar4 | 4;
            }
            UNLOCK();
          } while (!bVar5);
          return;
        }
      }
      uVar3 = synchronization_internal::MutexDelay(this_00,1,mode);
      mu = (pMVar2->mu_).super___atomic_base<long>._M_i;
      waitp = w->waitp;
      this_00 = (synchronization_internal *)(ulong)uVar3;
      in_RDX = extraout_RDX;
    } while (((waitp->how != (MuHow)kSharedS | 8) & (uint)mu) != 0);
  }
  w->next = (PerThreadSynch *)0x0;
  (w->state)._M_i = kAvailable;
  AbslInternalPerThreadSemPost((ThreadIdentity *)w);
  return;
}

Assistant:

void CondVar::Wakeup(PerThreadSynch *w) {
  if (w->waitp->timeout.has_timeout() || w->waitp->cvmu == nullptr) {
    // The waiting thread only needs to observe "w->state == kAvailable" to be
    // released, we must cache "cvmu" before clearing "next".
    Mutex *mu = w->waitp->cvmu;
    w->next = nullptr;
    w->state.store(PerThreadSynch::kAvailable, std::memory_order_release);
    Mutex::IncrementSynchSem(mu, w);
  } else {
    w->waitp->cvmu->Fer(w);
  }
}